

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.hpp
# Opt level: O3

void __thiscall
backend::codegen::Codegen::Codegen
          (Codegen *this,MirFunction *func,MirPackage *package,
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
          *extra_data,bool enable_cond_exec)

{
  _Rb_tree_header *p_Var1;
  char *pcVar2;
  iterator iVar3;
  element_type *peVar4;
  vector<unsigned_int,std::allocator<unsigned_int>> *pvVar5;
  iterator iVar6;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_00;
  iterator iVar7;
  ostream *poVar8;
  _Base_ptr p_Var9;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  *this_01;
  iterator iVar10;
  _Rb_tree_node_base *p_Var11;
  Tag *pTVar12;
  char *pcVar13;
  undefined1 *tag;
  map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>
  *__range3;
  ostream local_139;
  _Rb_tree_node_base *local_138;
  Function *local_130;
  size_type local_128;
  undefined1 local_120 [16];
  char *local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  _Alloc_hider _Stack_f8;
  undefined **local_f0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e8;
  undefined1 local_d8;
  undefined7 uStack_d7;
  undefined1 local_c8;
  MirFunction *local_c0;
  undefined1 local_b8 [25];
  undefined7 uStack_9f;
  undefined8 uStack_98;
  _Alloc_hider local_90;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_88;
  undefined8 uStack_78;
  size_t local_70;
  bool local_68;
  vector<unsigned_int,std::allocator<unsigned_int>> *local_60;
  undefined **local_58;
  undefined8 local_50;
  undefined1 local_48;
  map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>
  *local_40;
  _Base_ptr local_38;
  
  this->func = func;
  this->package = package;
  this->extra_data = extra_data;
  p_Var1 = &(this->reg_map)._M_t._M_impl.super__Rb_tree_header;
  (this->inst).
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->inst).
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->inst).
  super__Vector_base<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>,_std::allocator<std::unique_ptr<arm::Inst,_std::default_delete<arm::Inst>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(this->reg_map)._M_t._M_impl = 0;
  *(undefined8 *)&(this->reg_map)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->reg_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->reg_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->reg_map)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->reg_map)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->consts)._M_t._M_impl.super__Rb_tree_header;
  (this->consts)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->consts)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->consts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->consts)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->consts)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->var_use)._M_h._M_buckets = &(this->var_use)._M_h._M_single_bucket;
  (this->var_use)._M_h._M_bucket_count = 1;
  (this->var_use)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->var_use)._M_h._M_element_count = 0;
  (this->var_use)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->var_collapse)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->var_collapse)._M_h._M_bucket_count = 0;
  *(undefined8 *)&(this->var_collapse)._M_h._M_rehash_policy = 0;
  (this->var_collapse)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->var_collapse)._M_h._M_element_count = 0;
  (this->var_use)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->var_use)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->var_collapse)._M_h._M_buckets = &(this->var_collapse)._M_h._M_single_bucket;
  (this->var_collapse)._M_h._M_bucket_count = 1;
  (this->var_collapse)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->fixed_vars)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->fixed_vars)._M_h._M_bucket_count = 0;
  *(undefined8 *)&(this->fixed_vars)._M_h._M_rehash_policy = 0;
  (this->var_collapse)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->var_collapse)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->fixed_vars)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->fixed_vars)._M_h._M_element_count = 0;
  (this->fixed_vars)._M_h._M_buckets = &(this->fixed_vars)._M_h._M_single_bucket;
  (this->fixed_vars)._M_h._M_bucket_count = 1;
  (this->fixed_vars)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->fixed_vars)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->fixed_vars)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->phi_reg)._M_h._M_buckets = &(this->phi_reg)._M_h._M_single_bucket;
  (this->phi_reg)._M_h._M_bucket_count = 1;
  (this->phi_reg)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->phi_reg)._M_h._M_element_count = 0;
  (this->phi_reg)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->phi_reg)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->phi_reg)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->stack_space_allocation)._M_t._M_impl.super__Rb_tree_header;
  (this->stack_space_allocation)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->stack_space_allocation)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->stack_space_allocation)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->stack_space_allocation)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  local_60 = (vector<unsigned_int,std::allocator<unsigned_int>> *)&this->bb_ordering;
  local_40 = &this->inline_hint;
  local_138 = &(this->inline_hint)._M_t._M_impl.super__Rb_tree_header._M_header;
  (this->inline_hint)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->inline_hint)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->bb_ordering).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->bb_ordering).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->stack_space_allocation)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->bb_ordering).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->inline_hint)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = local_138;
  (this->inline_hint)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = local_138;
  (this->inline_hint)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->second_last_condition_code).super__Optional_base<arm::ConditionCode,_true,_true>._M_payload
  .super__Optional_payload_base<arm::ConditionCode>._M_engaged = false;
  (this->last_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
  super__Optional_payload_base<backend::codegen::LastJump>._M_engaged = false;
  (this->this_jump).super__Optional_base<backend::codegen::LastJump,_true,_true>._M_payload.
  super__Optional_payload_base<backend::codegen::LastJump>._M_engaged = false;
  this->vreg_gp_counter = 0;
  this->vreg_vd_counter = 0;
  this->vreg_vq_counter = 0;
  this->const_counter = 0;
  this->enable_cond_exec = enable_cond_exec;
  this->stack_size = 0;
  pTVar12 = (Tag *)&::optimization::BASIC_BLOCK_ORDERING_DATA_NAME_abi_cxx11_;
  local_c0 = func;
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
          ::find(&extra_data->_M_t,
                 (key_type *)&::optimization::BASIC_BLOCK_ORDERING_DATA_NAME_abi_cxx11_);
  local_38 = &(extra_data->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (iVar6._M_node == local_38) {
    local_139 = (ostream)0x0;
    AixLog::operator<<(&local_139,(Severity *)pTVar12);
    local_f0 = &PTR__Tag_001eaf88;
    local_e8._8_8_ = 0;
    local_d8 = 0;
    local_c8 = 1;
    local_e8._M_allocated_capacity = (size_type)&local_d8;
    AixLog::operator<<((ostream *)&local_f0,pTVar12);
    local_50 = std::chrono::_V2::system_clock::now();
    local_58 = &PTR__Timestamp_001eaf58;
    local_48 = 0;
    AixLog::operator<<((ostream *)&local_58,(Timestamp *)pTVar12);
    local_130 = (Function *)local_120;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Codegen","");
    pcVar2 = local_108._M_local_buf + 8;
    pcVar13 = 
    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.hpp"
    ;
    local_110 = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.hpp"
               ,"");
    local_b8._8_8_ = local_b8 + 0x18;
    local_b8._0_8_ = &PTR__Function_001eafb8;
    if (local_130 == (Function *)local_120) {
      uStack_98 = local_120._8_8_;
    }
    else {
      local_b8._8_8_ = local_130;
    }
    local_90._M_p = local_88._M_local_buf + 8;
    local_b8._16_8_ = local_128;
    local_128 = 0;
    local_120[0] = '\0';
    if (local_110 == pcVar2) {
      uStack_78 = _Stack_f8._M_p;
    }
    else {
      local_90._M_p = local_110;
    }
    local_88._M_allocated_capacity = local_108._M_allocated_capacity;
    local_108._M_allocated_capacity = 0;
    local_108._M_local_buf[8] = '\0';
    local_70 = 0x55;
    local_68 = false;
    local_130 = (Function *)local_120;
    local_110 = pcVar2;
    AixLog::operator<<((ostream *)local_b8,(Function *)pcVar13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"Cannot find order map for ",0x1a);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::clog,(local_c0->name)._M_dataplus._M_p,
                        (local_c0->name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," (2)",4);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
    std::ostream::put((char)poVar8);
    std::ostream::flush();
    AixLog::Function::~Function((Function *)local_b8);
    if (local_110 != pcVar2) {
      operator_delete(local_110,CONCAT71(local_108._9_7_,local_108._M_local_buf[8]) + 1);
    }
    pvVar5 = local_60;
    if (local_130 != (Function *)local_120) {
      operator_delete(local_130,CONCAT71(local_120._1_7_,local_120[0]) + 1);
    }
    local_f0 = &PTR__Tag_001eaf88;
    if ((undefined1 *)local_e8._M_allocated_capacity != &local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,CONCAT71(uStack_d7,local_d8) + 1);
    }
    p_Var9 = (local_c0->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(local_c0->basic_blks)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var9 != p_Var1) {
      do {
        local_b8._0_4_ = p_Var9[1]._M_color;
        iVar3._M_current =
             (this->bb_ordering).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->bb_ordering).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvVar5,iVar3,
                     (uint *)local_b8);
        }
        else {
          *iVar3._M_current = p_Var9[1]._M_color;
          (this->bb_ordering).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
        }
        p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
      } while ((_Rb_tree_header *)p_Var9 != p_Var1);
    }
  }
  else {
    this_00 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)std::
                 __any_caster<std::unordered_map<std::__cxx11::string,std::vector<unsigned_int,std::allocator<unsigned_int>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<unsigned_int,std::allocator<unsigned_int>>>>>>
                           ((any *)(iVar6._M_node + 2));
    if (this_00 ==
        (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
         *)0x0) {
      std::__throw_bad_any_cast();
    }
    pTVar12 = (Tag *)&local_c0->name;
    iVar7 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find(this_00,(key_type *)pTVar12);
    if (iVar7.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      local_139 = (ostream)0x0;
      AixLog::operator<<(&local_139,(Severity *)pTVar12);
      local_f0 = &PTR__Tag_001eaf88;
      local_e8._8_8_ = 0;
      local_d8 = 0;
      local_c8 = 1;
      local_e8._M_allocated_capacity = (size_type)&local_d8;
      AixLog::operator<<((ostream *)&local_f0,pTVar12);
      local_50 = std::chrono::_V2::system_clock::now();
      local_58 = &PTR__Timestamp_001eaf58;
      local_48 = 0;
      AixLog::operator<<((ostream *)&local_58,(Timestamp *)pTVar12);
      local_130 = (Function *)local_120;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Codegen","");
      pcVar2 = local_108._M_local_buf + 8;
      pcVar13 = 
      "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.hpp"
      ;
      local_110 = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_110,
                 "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.hpp"
                 ,"");
      local_b8._8_8_ = local_b8 + 0x18;
      local_b8._0_8_ = &PTR__Function_001eafb8;
      if (local_130 == (Function *)local_120) {
        uStack_98 = local_120._8_8_;
      }
      else {
        local_b8._8_8_ = local_130;
      }
      local_90._M_p = local_88._M_local_buf + 8;
      local_b8._16_8_ = local_128;
      local_128 = 0;
      local_120[0] = '\0';
      if (local_110 == pcVar2) {
        uStack_78 = _Stack_f8._M_p;
      }
      else {
        local_90._M_p = local_110;
      }
      local_88._M_allocated_capacity = local_108._M_allocated_capacity;
      local_108._M_allocated_capacity = 0;
      local_108._M_local_buf[8] = '\0';
      local_70 = 0x4e;
      local_68 = false;
      local_130 = (Function *)local_120;
      local_110 = pcVar2;
      AixLog::operator<<((ostream *)local_b8,(Function *)pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::clog,"Cannot find order map for ",0x1a);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::clog,(local_c0->name)._M_dataplus._M_p,
                          (local_c0->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," (1)",4);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      AixLog::Function::~Function((Function *)local_b8);
      if (local_110 != pcVar2) {
        operator_delete(local_110,CONCAT71(local_108._9_7_,local_108._M_local_buf[8]) + 1);
      }
      pvVar5 = local_60;
      if (local_130 != (Function *)local_120) {
        operator_delete(local_130,CONCAT71(local_120._1_7_,local_120[0]) + 1);
      }
      local_f0 = &PTR__Tag_001eaf88;
      if ((undefined1 *)local_e8._M_allocated_capacity != &local_d8) {
        operator_delete((void *)local_e8._M_allocated_capacity,CONCAT71(uStack_d7,local_d8) + 1);
      }
      p_Var9 = (local_c0->basic_blks)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var1 = &(local_c0->basic_blks)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var9 != p_Var1) {
        do {
          local_b8._0_4_ = p_Var9[1]._M_color;
          iVar3._M_current =
               (this->bb_ordering).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_finish;
          if (iVar3._M_current ==
              (this->bb_ordering).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)pvVar5,iVar3,
                       (uint *)local_b8);
          }
          else {
            *iVar3._M_current = p_Var9[1]._M_color;
            (this->bb_ordering).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_finish = iVar3._M_current + 1;
          }
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9);
        } while ((_Rb_tree_header *)p_Var9 != p_Var1);
      }
    }
    else {
      local_139 = (ostream)0x0;
      AixLog::operator<<(&local_139,(Severity *)pTVar12);
      local_e8._M_allocated_capacity = (size_type)&local_d8;
      local_f0 = &PTR__Tag_001eaf88;
      local_e8._8_8_ = 0;
      local_d8 = 0;
      local_c8 = 1;
      AixLog::operator<<((ostream *)&local_f0,pTVar12);
      local_50 = std::chrono::_V2::system_clock::now();
      local_58 = &PTR__Timestamp_001eaf58;
      local_48 = 0;
      AixLog::operator<<((ostream *)&local_58,(Timestamp *)pTVar12);
      local_130 = (Function *)local_120;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Codegen","");
      pcVar2 = local_108._M_local_buf + 8;
      pcVar13 = 
      "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.hpp"
      ;
      local_110 = pcVar2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_110,
                 "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.hpp"
                 ,"");
      local_b8._8_8_ = local_b8 + 0x18;
      local_b8._0_8_ = &PTR__Function_001eafb8;
      if (local_130 == (Function *)local_120) {
        uStack_98 = local_120._8_8_;
      }
      else {
        local_b8._8_8_ = local_130;
      }
      local_90._M_p = local_88._M_local_buf + 8;
      local_b8._16_8_ = local_128;
      local_128 = 0;
      local_120[0] = '\0';
      if (local_110 == pcVar2) {
        uStack_78 = _Stack_f8._M_p;
      }
      else {
        local_90._M_p = local_110;
      }
      local_88._M_allocated_capacity = local_108._M_allocated_capacity;
      local_108._M_allocated_capacity = 0;
      local_108._M_local_buf[8] = '\0';
      local_70 = 0x48;
      local_68 = false;
      local_130 = (Function *)local_120;
      local_110 = pcVar2;
      AixLog::operator<<((ostream *)local_b8,(Function *)pcVar13);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::clog,"Found order map for ",0x14);
      poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::clog,(local_c0->name)._M_dataplus._M_p,
                          (local_c0->name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," with ",6);
      poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8," elements",9);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
      std::ostream::put((char)poVar8);
      std::ostream::flush();
      AixLog::Function::~Function((Function *)local_b8);
      if (local_110 != pcVar2) {
        operator_delete(local_110,CONCAT71(local_108._9_7_,local_108._M_local_buf[8]) + 1);
      }
      if (local_130 != (Function *)local_120) {
        operator_delete(local_130,CONCAT71(local_120._1_7_,local_120[0]) + 1);
      }
      local_f0 = &PTR__Tag_001eaf88;
      if ((undefined1 *)local_e8._M_allocated_capacity != &local_d8) {
        operator_delete((void *)local_e8._M_allocated_capacity,CONCAT71(uStack_d7,local_d8) + 1);
      }
      std::vector<unsigned_int,std::allocator<unsigned_int>>::
      _M_range_insert<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>>
                (local_60,(this->bb_ordering).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_finish,
                 *(undefined8 *)
                  ((long)iVar7.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true>
                         ._M_cur + 0x28),
                 *(undefined8 *)
                  ((long)iVar7.
                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>,_true>
                         ._M_cur + 0x30));
    }
  }
  tag = ::optimization::inline_blks_abi_cxx11_;
  iVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
          ::find(&extra_data->_M_t,(key_type *)::optimization::inline_blks_abi_cxx11_);
  if (iVar6._M_node != local_38) {
    local_139 = (ostream)0x0;
    AixLog::operator<<(&local_139,tag);
    local_e8._M_allocated_capacity = (size_type)&local_d8;
    local_f0 = &PTR__Tag_001eaf88;
    local_e8._8_8_ = 0;
    local_d8 = 0;
    local_c8 = 1;
    AixLog::operator<<((ostream *)&local_f0,(Tag *)tag);
    local_50 = std::chrono::_V2::system_clock::now();
    local_58 = &PTR__Timestamp_001eaf58;
    local_48 = 0;
    AixLog::operator<<((ostream *)&local_58,(Timestamp *)tag);
    local_130 = (Function *)local_120;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Codegen","");
    pcVar2 = local_108._M_local_buf + 8;
    pcVar13 = 
    "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.hpp"
    ;
    local_110 = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.hpp"
               ,"");
    local_b8._8_8_ = local_b8 + 0x18;
    local_b8._0_8_ = &PTR__Function_001eafb8;
    if (local_130 == (Function *)local_120) {
      uStack_98 = local_120._8_8_;
    }
    else {
      local_b8._8_8_ = local_130;
    }
    uStack_9f = local_120._1_7_;
    local_b8[0x18] = local_120[0];
    local_90._M_p = local_88._M_local_buf + 8;
    local_b8._16_8_ = local_128;
    local_128 = 0;
    local_120[0] = '\0';
    if (local_110 == pcVar2) {
      uStack_78 = _Stack_f8._M_p;
    }
    else {
      local_90._M_p = local_110;
    }
    local_88._9_7_ = local_108._9_7_;
    local_88._M_local_buf[8] = local_108._M_local_buf[8];
    local_88._M_allocated_capacity = local_108._M_allocated_capacity;
    local_108._M_allocated_capacity = 0;
    local_108._M_local_buf[8] = '\0';
    local_70 = 0x5e;
    local_68 = false;
    local_130 = (Function *)local_120;
    local_110 = pcVar2;
    AixLog::operator<<((ostream *)local_b8,(Function *)pcVar13);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"Found inline hint in extra data",0x1f);
    std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    AixLog::Function::~Function((Function *)local_b8);
    if (local_110 != pcVar2) {
      operator_delete(local_110,CONCAT71(local_108._9_7_,local_108._M_local_buf[8]) + 1);
    }
    if (local_130 != (Function *)local_120) {
      operator_delete(local_130,CONCAT71(local_120._1_7_,local_120[0]) + 1);
    }
    local_f0 = &PTR__Tag_001eaf88;
    if ((undefined1 *)local_e8._M_allocated_capacity != &local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,CONCAT71(uStack_d7,local_d8) + 1);
    }
    this_01 = (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
               *)std::
                 __any_caster<std::unordered_map<std::__cxx11::string,std::map<unsigned_int,arm::ConditionCode,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,arm::ConditionCode>>>,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::map<unsigned_int,arm::ConditionCode,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,arm::ConditionCode>>>>>>>
                           ((any *)(iVar6._M_node + 2));
    if (this_01 ==
        (_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
         *)0x0) {
      std::__throw_bad_any_cast();
    }
    iVar10 = std::
             _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
             ::find(this_01,&local_c0->name);
    if (iVar10.
        super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>_>,_true>
        ._M_cur == (__node_type *)0x0) {
      std::__throw_out_of_range("_Map_base::at");
    }
    pTVar12 = (Tag *)((long)iVar10.
                            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::map<unsigned_int,_arm::ConditionCode,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>_>,_true>
                            ._M_cur + 0x28);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_arm::ConditionCode>,_std::_Select1st<std::pair<const_unsigned_int,_arm::ConditionCode>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>
    ::operator=(&local_40->_M_t,
                (_Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_arm::ConditionCode>,_std::_Select1st<std::pair<const_unsigned_int,_arm::ConditionCode>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_arm::ConditionCode>_>_>
                 *)pTVar12);
    local_139 = (ostream)0x0;
    AixLog::operator<<(&local_139,(Severity *)pTVar12);
    local_f0 = &PTR__Tag_001eaf88;
    local_e8._M_allocated_capacity = (size_type)&local_d8;
    local_e8._8_8_ = 0;
    local_d8 = 0;
    local_c8 = 1;
    AixLog::operator<<((ostream *)&local_f0,pTVar12);
    local_50 = std::chrono::_V2::system_clock::now();
    local_58 = &PTR__Timestamp_001eaf58;
    local_48 = 0;
    AixLog::operator<<((ostream *)&local_58,(Timestamp *)pTVar12);
    local_130 = (Function *)local_120;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Codegen","");
    local_110 = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.hpp"
               ,"");
    local_b8._0_8_ = &PTR__Function_001eafb8;
    local_90._M_p = local_88._M_local_buf + 8;
    if (local_130 == (Function *)local_120) {
      uStack_98 = local_120._8_8_;
      local_b8._8_8_ = (Function *)(local_b8 + 0x18);
    }
    else {
      local_b8._8_8_ = local_130;
    }
    uStack_9f = local_120._1_7_;
    local_b8[0x18] = local_120[0];
    local_b8._16_8_ = local_128;
    local_128 = 0;
    local_120[0] = '\0';
    if (local_110 == pcVar2) {
      uStack_78 = _Stack_f8._M_p;
    }
    else {
      local_90._M_p = local_110;
    }
    local_88._9_7_ = local_108._9_7_;
    local_88._M_local_buf[8] = local_108._M_local_buf[8];
    local_88._M_allocated_capacity = local_108._M_allocated_capacity;
    local_108._M_allocated_capacity = 0;
    local_108._M_local_buf[8] = '\0';
    local_70 = 100;
    local_68 = false;
    local_130 = (Function *)local_120;
    local_110 = pcVar2;
    AixLog::operator<<((ostream *)local_b8,(Function *)(local_b8 + 0x18));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::clog,"Inline hint has ",0x10);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
    pcVar13 = " items: ";
    std::__ostream_insert<char,std::char_traits<char>>(poVar8," items: ",8);
    AixLog::Function::~Function((Function *)local_b8);
    if (local_110 != pcVar2) {
      pcVar13 = (char *)(CONCAT71(local_108._9_7_,local_108._M_local_buf[8]) + 1);
      operator_delete(local_110,(ulong)pcVar13);
    }
    if (local_130 != (Function *)local_120) {
      pcVar13 = (char *)(CONCAT71(local_120._1_7_,local_120[0]) + 1);
      operator_delete(local_130,(ulong)pcVar13);
    }
    local_f0 = &PTR__Tag_001eaf88;
    if ((undefined1 *)local_e8._M_allocated_capacity != &local_d8) {
      pcVar13 = (char *)(CONCAT71(uStack_d7,local_d8) + 1);
      operator_delete((void *)local_e8._M_allocated_capacity,(ulong)pcVar13);
    }
    p_Var11 = (this->inline_hint)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (p_Var11 != local_138) {
      do {
        local_139 = (ostream)0x0;
        AixLog::operator<<(&local_139,(Severity *)pcVar13);
        local_f0 = &PTR__Tag_001eaf88;
        local_e8._M_allocated_capacity = (size_type)&local_d8;
        local_e8._8_8_ = 0;
        local_d8 = 0;
        local_c8 = 1;
        AixLog::operator<<((ostream *)&local_f0,(Tag *)pcVar13);
        local_50 = std::chrono::_V2::system_clock::now();
        local_58 = &PTR__Timestamp_001eaf58;
        local_48 = 0;
        AixLog::operator<<((ostream *)&local_58,(Timestamp *)pcVar13);
        local_130 = (Function *)local_120;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Codegen","");
        local_110 = pcVar2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_110,
                   "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.hpp"
                   ,"");
        local_b8._0_8_ = &PTR__Function_001eafb8;
        local_90._M_p = local_88._M_local_buf + 8;
        if (local_130 == (Function *)local_120) {
          uStack_98 = local_120._8_8_;
          local_b8._8_8_ = (Function *)(local_b8 + 0x18);
        }
        else {
          local_b8._8_8_ = local_130;
        }
        uStack_9f = local_120._1_7_;
        local_b8[0x18] = local_120[0];
        local_b8._16_8_ = local_128;
        local_128 = 0;
        local_120[0] = '\0';
        if (local_110 == pcVar2) {
          uStack_78 = _Stack_f8._M_p;
        }
        else {
          local_90._M_p = local_110;
        }
        local_88._9_7_ = local_108._9_7_;
        local_88._M_local_buf[8] = local_108._M_local_buf[8];
        local_88._M_allocated_capacity = local_108._M_allocated_capacity;
        local_108._M_allocated_capacity = 0;
        local_108._M_local_buf[8] = '\0';
        local_70 = 0x66;
        local_68 = false;
        local_130 = (Function *)local_120;
        local_110 = pcVar2;
        AixLog::operator<<((ostream *)local_b8,(Function *)(local_b8 + 0x18));
        poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)&std::clog);
        pcVar13 = " ";
        std::__ostream_insert<char,std::char_traits<char>>(poVar8," ",1);
        AixLog::Function::~Function((Function *)local_b8);
        if (local_110 != pcVar2) {
          pcVar13 = (char *)(CONCAT71(local_108._9_7_,local_108._M_local_buf[8]) + 1);
          operator_delete(local_110,(ulong)pcVar13);
        }
        if (local_130 != (Function *)local_120) {
          pcVar13 = (char *)(CONCAT71(local_120._1_7_,local_120[0]) + 1);
          operator_delete(local_130,(ulong)pcVar13);
        }
        local_f0 = &PTR__Tag_001eaf88;
        if ((undefined1 *)local_e8._M_allocated_capacity != &local_d8) {
          pcVar13 = (char *)(CONCAT71(uStack_d7,local_d8) + 1);
          operator_delete((void *)local_e8._M_allocated_capacity,(ulong)pcVar13);
        }
        p_Var11 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var11);
      } while (p_Var11 != local_138);
    }
    local_139 = (ostream)0x0;
    AixLog::operator<<(&local_139,(Severity *)pcVar13);
    local_f0 = &PTR__Tag_001eaf88;
    local_e8._M_allocated_capacity = (size_type)&local_d8;
    local_e8._8_8_ = 0;
    local_d8 = 0;
    local_c8 = 1;
    AixLog::operator<<((ostream *)&local_f0,(Tag *)pcVar13);
    local_50 = std::chrono::_V2::system_clock::now();
    local_58 = &PTR__Timestamp_001eaf58;
    local_48 = 0;
    AixLog::operator<<((ostream *)&local_58,(Timestamp *)pcVar13);
    local_130 = (Function *)local_120;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"Codegen","");
    local_110 = pcVar2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_110,
               "/workspace/llm4binary/github/license_c_cmakelists/segviol[P]indigo/backend/codegen/codegen.hpp"
               ,"");
    local_b8._0_8_ = &PTR__Function_001eafb8;
    local_90._M_p = local_88._M_local_buf + 8;
    if (local_130 == (Function *)local_120) {
      uStack_98 = local_120._8_8_;
      local_b8._8_8_ = (Function *)(local_b8 + 0x18);
    }
    else {
      local_b8._8_8_ = local_130;
    }
    uStack_9f = local_120._1_7_;
    local_b8[0x18] = local_120[0];
    local_b8._16_8_ = local_128;
    local_128 = 0;
    local_120[0] = '\0';
    if (local_110 == pcVar2) {
      uStack_78 = _Stack_f8._M_p;
    }
    else {
      local_90._M_p = local_110;
    }
    local_88._9_7_ = local_108._9_7_;
    local_88._M_local_buf[8] = local_108._M_local_buf[8];
    local_88._M_allocated_capacity = local_108._M_allocated_capacity;
    local_108._M_allocated_capacity = 0;
    local_108._M_local_buf[8] = '\0';
    local_70 = 0x67;
    local_68 = false;
    local_130 = (Function *)local_120;
    local_110 = pcVar2;
    AixLog::operator<<((ostream *)local_b8,(Function *)(local_b8 + 0x18));
    std::ios::widen((char)*(undefined8 *)(std::clog + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    AixLog::Function::~Function((Function *)local_b8);
    if (local_110 != pcVar2) {
      operator_delete(local_110,CONCAT71(local_108._9_7_,local_108._M_local_buf[8]) + 1);
    }
    if (local_130 != (Function *)local_120) {
      operator_delete(local_130,CONCAT71(local_120._1_7_,local_120[0]) + 1);
    }
    local_f0 = &PTR__Tag_001eaf88;
    if ((undefined1 *)local_e8._M_allocated_capacity != &local_d8) {
      operator_delete((void *)local_e8._M_allocated_capacity,CONCAT71(uStack_d7,local_d8) + 1);
    }
  }
  peVar4 = (local_c0->type).super___shared_ptr<mir::types::FunctionTy,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  this->param_size =
       (int)((ulong)((long)(peVar4->params).
                           super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(peVar4->params).
                          super__Vector_base<std::shared_ptr<mir::types::Ty>,_std::allocator<std::shared_ptr<mir::types::Ty>_>_>
                          ._M_impl.super__Vector_impl_data._M_start) >> 4);
  return;
}

Assistant:

Codegen(mir::inst::MirFunction& func, mir::inst::MirPackage& package,
          std::map<std::string, std::any>& extra_data,
          bool enable_cond_exec = true)
      : func(func),
        package(package),
        extra_data(extra_data),
        inst(),
        reg_map(),
        fixed_vars(),
        var_collapse(),
        bb_ordering(),
        enable_cond_exec(enable_cond_exec) {
    {
      // Calculate ordering
      auto any_ordering =
          extra_data.find(optimization::BASIC_BLOCK_ORDERING_DATA_NAME);
      if (any_ordering != extra_data.end()) {
        auto& order_map = std::any_cast<optimization::BasicBlockOrderingType&>(
            any_ordering->second);
        auto o = order_map.find(func.name);
        if (o != order_map.end()) {
          LOG(TRACE) << "Found order map for " << func.name << " with "
                     << o->second.size() << " elements" << std::endl;
          auto& ordering = o->second;
          this->bb_ordering.insert(bb_ordering.end(), ordering.begin(),
                                   ordering.end());
        } else {
          LOG(TRACE) << "Cannot find order map for " << func.name << " (1)"
                     << std::endl;
          for (auto& a : func.basic_blks) {
            bb_ordering.push_back(a.first);
          }
        }
      } else {
        LOG(TRACE) << "Cannot find order map for " << func.name << " (2)"
                   << std::endl;
        for (auto& a : func.basic_blks) {
          bb_ordering.push_back(a.first);
        }
      }
    }
    auto inline_hint = extra_data.find(optimization::inline_blks);
    if (inline_hint != extra_data.end()) {
      LOG(TRACE) << "Found inline hint in extra data" << std::endl;

      this->inline_hint =
          std::any_cast<optimization::InlineBlksType&>(inline_hint->second)
              .at(func.name);

      LOG(TRACE) << "Inline hint has " << this->inline_hint.size()
                 << " items: ";
      for (auto i : this->inline_hint) LOG(TRACE) << i.first << " ";
      LOG(TRACE) << std::endl;
    }
    param_size = func.type->params.size();
  }